

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  cmCustomCommandLines *pcVar3;
  cmGeneratorTarget *this_01;
  char *pcVar4;
  allocator local_59;
  _Alloc_hider local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar3 = cmCustomCommand::GetCommandLines(this->CC);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                      (this->LG,*(string **)
                                 &(pcVar3->
                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ).
                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ._M_impl.super__Vector_impl_data._M_start[c].
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      );
  if ((this_01 != (cmGeneratorTarget *)0x0) &&
     (TVar2 = cmGeneratorTarget::GetType(this_01), TVar2 == EXECUTABLE)) {
    bVar1 = cmGeneratorTarget::IsImported(this_01);
    if (!bVar1) {
      this_00 = this->LG->Makefile;
      std::__cxx11::string::string((string *)local_50,"CMAKE_CROSSCOMPILING",(allocator *)&local_58)
      ;
      bVar1 = cmMakefile::IsOn(this_00,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      if (bVar1) goto LAB_003f2747;
    }
    pcVar4 = cmGeneratorTarget::GetLocation(this_01,&this->Config);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)local_50);
    return __return_storage_ptr__;
  }
LAB_003f2747:
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_58,(string *)this->GE);
  local_50._0_8_ = &local_40;
  local_50._8_8_ = 0;
  local_40._M_local_buf[0] = '\0';
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_58._M_p,this->LG,&this->Config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_50);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,&local_59);
  std::__cxx11::string::~string((string *)local_50);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  std::string const& argv0 = this->CC.GetCommandLines()[c][0];
  cmGeneratorTarget* target =
      this->LG->FindGeneratorTargetToUse(argv0);
  if(target && target->GetType() == cmState::EXECUTABLE &&
     (target->IsImported()
      || !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")))
    {
    return target->GetLocation(this->Config);
    }
  return this->GE->Parse(argv0)->Evaluate(this->LG, this->Config);
}